

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ap.c
# Opt level: O1

int create_directory(char *dir)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  
  if (dir == (char *)0x0) {
    pcVar3 = "Invalid argument: dir\n";
  }
  else {
    if (*dir != '\0') {
      iVar1 = mkdir(dir,0x1c0);
      if (iVar1 == 0) {
        return 0;
      }
      piVar2 = __errno_location();
      if (*piVar2 == 0x11) {
        return 0;
      }
      pcVar3 = strerror(*piVar2);
      ap_log(AP_LOG_LEVEL_ERROR,"Can not create directory \'%s\', error: \'%s\'\n",dir,pcVar3);
      return 6;
    }
    pcVar3 = "Empty path\n";
  }
  ap_log(AP_LOG_LEVEL_ERROR,pcVar3);
  return 3;
}

Assistant:

static int create_directory (const char *dir)
{
	int			rc				= AP_NO_ERROR;
	int			rc_os;

	AP_VALIDATE_PTR_ARGUMENT (dir);

	if (*dir == '\0')
	{
		ap_error ("Empty path\n");
		rc = AP_ERROR_INVALID_ARGUMENT;

		goto finish;
	}

#	if defined (_WIN32)
	rc_os = _mkdir (dir);
#	else
	rc_os = mkdir (dir, 0700);
#	endif
	if (rc_os != 0)
	{
		if (errno != EEXIST)
		{
			ap_error ("Can not create directory '%s', error: '%s'\n", dir, strerror (errno));
			rc = AP_ERROR_ENVIRONMENT;

			goto finish;
		}
	}

finish:
	return rc;
}